

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::
     or_<jsonip::grammar::bool_,jsonip::grammar::double_,jsonip::grammar::string_rule,jsonip::grammar::array_,jsonip::grammar::object_,jsonip::grammar::null_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  pointer *pppVar2;
  iterator __position;
  semantic_state *this;
  pointer ppVar3;
  helper *phVar4;
  PositionType pcVar5;
  bool bVar6;
  bool bVar7;
  pointer pSVar8;
  PositionType p;
  undefined1 auStack_30 [8];
  State cur_state;
  
  auStack_30 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  __position._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,__position,(State *)auStack_30);
  }
  else {
    (__position._M_current)->pos_ = (PositionType)auStack_30;
    (__position._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  bVar7 = or_<jsonip::grammar::true_p,jsonip::grammar::false_p,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
  ;
  bVar6 = true;
  if (!bVar7) {
    bVar7 = semantic_rule<jsonip::grammar::double_,jsonip::parser::number_>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar7) {
      bVar7 = semantic_rule<jsonip::grammar::string_rule,jsonip::parser::string_>::
              match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                        (state);
      if (!bVar7) {
        bVar7 = seq_<jsonip::grammar::array_start,jsonip::grammar::array_body,jsonip::grammar::array_end,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                          (state);
        if (!bVar7) {
          bVar7 = seq_<jsonip::grammar::object_start,jsonip::grammar::object_body,jsonip::grammar::object_end,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                  ::
                  match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                            (state);
          if (!bVar7) {
            bVar7 = seq_<jsonip::parser::char_<(char)110>,jsonip::parser::char_<(char)117>,jsonip::parser::char_<(char)108>,jsonip::parser::char_<(char)108>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                    ::
                    match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                              (state);
            if (bVar7) {
              this = state->ss_;
              semantic_state::pre(this);
              ppVar3 = (this->state).
                       super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              phVar4 = ppVar3[-1].second;
              (**(code **)(*(long *)phVar4 + 0x28))(phVar4,ppVar3 + -1);
              pppVar2 = &(this->state).
                         super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + -1;
            }
            else {
              bVar6 = false;
            }
          }
        }
      }
    }
  }
  pcVar5 = state->reader_->pos_;
  if (bVar6) {
    if (state->max_pos_ < pcVar5) {
      state->max_pos_ = pcVar5;
    }
    pSVar8 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (state->max_pos_ < pcVar5) {
      state->max_pos_ = pcVar5;
    }
    state->reader_->pos_ =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pSVar8 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar8[-1].line_;
  }
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar8 + -1;
  return bVar6;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) || C1::match(state) ||
                       C2::match(state) || C3::match(state) ||
                       C4::match(state) || C5::match(state) ||
                       C6::match(state) || C7::match(state);

            var ? state.commit() : state.rollback();

            return var;
        }